

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::fileStatus(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  string filename;
  string local_68;
  path local_48;
  
  requireDStackDepth(this,2,"OPEN-FILE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  moveFromDataSpace(this,&local_68,uVar2,(ulong)uVar3);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,&local_68,auto_format);
  cVar1 = std::filesystem::status(&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  ForthStack<unsigned_int>::setTop(this_00,1,0);
  uVar2 = 0;
  if (cVar1 == -1) {
    uVar2 = 0xffffffbd;
  }
  if (cVar1 == '\0') {
    uVar2 = 0xffffffbd;
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void fileStatus() {
	REQUIRE_DSTACK_DEPTH(2, "OPEN-FILE");

	auto caddr = dStack.getTop(1);
	auto length = SIZE_T(dStack.getTop());
	
	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto exists = std::filesystem::exists(filename);
	dStack.setTop(1, 0);
	dStack.setTop(exists? 0: errorFileStatus );
}